

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

uint32_t duckdb::ParquetCrypto::Write
                   (TBase *object,TProtocol *oprot,string *key,EncryptionUtil *encryption_util_p)

{
  uint32_t uVar1;
  element_type *peVar2;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> *in_RCX;
  TCompactProtocolFactoryT<duckdb::EncryptionTransport> *in_RDX;
  long *in_RDI;
  EncryptionTransport *etrans;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> eprot;
  TCompactProtocolFactoryT<duckdb::EncryptionTransport> tproto_factory;
  EncryptionTransport *in_stack_00000fa0;
  TProtocol *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  EncryptionUtil *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  TProtocol *in_stack_ffffffffffffff88;
  __shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2> local_40 [2];
  
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::EncryptionTransport>::
  TCompactProtocolFactoryT
            ((TCompactProtocolFactoryT<duckdb::EncryptionTransport> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::
  make_shared<duckdb::EncryptionTransport,duckdb_apache::thrift::protocol::TProtocol&,std::__cxx11::string_const&,duckdb::EncryptionUtil_const&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::
  shared_ptr<duckdb::EncryptionTransport,void>
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (shared_ptr<duckdb::EncryptionTransport> *)in_stack_ffffffffffffff48);
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::EncryptionTransport>::
  getProtocol(in_RDX,in_RCX);
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x61135f);
  std::shared_ptr<duckdb::EncryptionTransport>::~shared_ptr
            ((shared_ptr<duckdb::EncryptionTransport> *)0x611369);
  std::
  __shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x611373);
  duckdb_apache::thrift::protocol::TProtocol::getTransport(in_stack_ffffffffffffff48);
  std::
  __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x6113a0);
  peVar2 = std::__shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>
           ::get(local_40);
  (**(code **)(*in_RDI + 0x18))(in_RDI,peVar2);
  uVar1 = EncryptionTransport::Finalize(in_stack_00000fa0);
  std::shared_ptr<duckdb_apache::thrift::protocol::TProtocol>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::protocol::TProtocol> *)0x6113ee);
  duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::EncryptionTransport>::
  ~TCompactProtocolFactoryT((TCompactProtocolFactoryT<duckdb::EncryptionTransport> *)0x6113fb);
  return uVar1;
}

Assistant:

uint32_t ParquetCrypto::Write(const TBase &object, TProtocol &oprot, const string &key,
                              const EncryptionUtil &encryption_util_p) {
	// Create encryption protocol
	TCompactProtocolFactoryT<EncryptionTransport> tproto_factory;
	auto eprot = tproto_factory.getProtocol(std::make_shared<EncryptionTransport>(oprot, key, encryption_util_p));
	auto &etrans = reinterpret_cast<EncryptionTransport &>(*eprot->getTransport());

	// Write the object in memory
	object.write(eprot.get());

	// Encrypt and write to oprot
	return etrans.Finalize();
}